

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O0

size_t mserialize::
       StructSerializer<binlog::WriterProp,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::id>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::WriterProp::*,_&binlog::WriterProp::name>,_std::integral_constant<unsigned_long_binlog::WriterProp::*,_&binlog::WriterProp::batchSize>_>
       ::serialized_size(WriterProp *t)

{
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [4];
  size_t result;
  size_t field_sizes [4];
  offset_in_WriterProp_to_unsigned_long in_stack_ffffffffffffffa8;
  WriterProp *in_stack_ffffffffffffffb0;
  long *local_40;
  size_t local_30;
  long local_28;
  size_t local_20;
  size_t local_18;
  long local_8;
  
  local_28 = 0;
  local_20 = StructSerializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
             ::serialized_size_member<binlog::WriterProp,unsigned_long>
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18 = StructSerializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
             ::serialized_size_member<binlog::WriterProp,std::__cxx11::string>
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  StructSerializer<binlog::WriterProp,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::id>,std::integral_constant<std::__cxx11::string_binlog::WriterProp::*,&binlog::WriterProp::name>,std::integral_constant<unsigned_long_binlog::WriterProp::*,&binlog::WriterProp::batchSize>>
  ::serialized_size_member<binlog::WriterProp,unsigned_long>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_30 = 0;
  for (local_40 = &local_28; local_40 != &local_8; local_40 = local_40 + 1) {
    local_30 = *local_40 + local_30;
  }
  return local_30;
}

Assistant:

static std::size_t serialized_size(const T& t)
  {
    const std::size_t field_sizes[] = {0, serialized_size_member(t, Members::value)...};

    std::size_t result = 0;
    for (auto s : field_sizes) { result += s; }
    return result;
  }